

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O0

void Kit_DsdTruth(Kit_DsdNtk_t *pNtk,uint *pTruthRes)

{
  ushort uVar1;
  int nNodes;
  Kit_DsdMan_t *p_00;
  uint *pIn;
  uint *pTruth;
  Kit_DsdMan_t *p;
  uint *pTruthRes_local;
  Kit_DsdNtk_t *pNtk_local;
  
  uVar1 = pNtk->nVars;
  nNodes = Kit_DsdNtkObjNum(pNtk);
  p_00 = Kit_DsdManAlloc((uint)uVar1,nNodes);
  pIn = Kit_DsdTruthCompute(p_00,pNtk);
  Kit_TruthCopy(pTruthRes,pIn,(uint)pNtk->nVars);
  Kit_DsdManFree(p_00);
  return;
}

Assistant:

void Kit_DsdTruth( Kit_DsdNtk_t * pNtk, unsigned * pTruthRes )
{
    Kit_DsdMan_t * p;
    unsigned * pTruth;
    p = Kit_DsdManAlloc( pNtk->nVars, Kit_DsdNtkObjNum(pNtk) );
    pTruth = Kit_DsdTruthCompute( p, pNtk );
    Kit_TruthCopy( pTruthRes, pTruth, pNtk->nVars );
    Kit_DsdManFree( p );
}